

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O1

int __thiscall QMetaObjectBuilder::indexOfEnumerator(QMetaObjectBuilder *this,QByteArray *name)

{
  pointer pQVar1;
  pointer pQVar2;
  bool bVar3;
  int unaff_EBX;
  pointer pQVar4;
  pointer rhs;
  
  rhs = (this->d->enumerators).
        super__Vector_base<QMetaEnumBuilderPrivate,_std::allocator<QMetaEnumBuilderPrivate>_>.
        _M_impl.super__Vector_impl_data._M_start;
  pQVar1 = (this->d->enumerators).
           super__Vector_base<QMetaEnumBuilderPrivate,_std::allocator<QMetaEnumBuilderPrivate>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pQVar4 = rhs;
  while( true ) {
    if (rhs == pQVar1) {
      return -1;
    }
    bVar3 = ::operator==(name,&rhs->name);
    if (bVar3) {
      pQVar2 = (this->d->enumerators).
               super__Vector_base<QMetaEnumBuilderPrivate,_std::allocator<QMetaEnumBuilderPrivate>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pQVar2 == (this->d->enumerators).
                    super__Vector_base<QMetaEnumBuilderPrivate,_std::allocator<QMetaEnumBuilderPrivate>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        indexOfEnumerator();
      }
      unaff_EBX = (int)((ulong)((long)pQVar4 - (long)pQVar2) >> 4) * -0x49249249;
    }
    if (bVar3) break;
    rhs = (pointer)((long)rhs + 0x70);
    pQVar4 = (pointer)((long)pQVar4 + 0x70);
  }
  return unaff_EBX;
}

Assistant:

int QMetaObjectBuilder::indexOfEnumerator(const QByteArray &name)
{
    for (const auto &enumerator : d->enumerators) {
        if (name == enumerator.name)
            return int(&enumerator - &d->enumerators.front());
    }
    return -1;
}